

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O1

BlockMemoryPool * __thiscall
cppnet::AlloterWrap::PoolNew<cppnet::BlockMemoryPool,unsigned_short_const&,unsigned_short_const&>
          (AlloterWrap *this,unsigned_short *args,unsigned_short *args_1)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  BlockMemoryPool *this_00;
  
  peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Alloter[3])(peVar1,0x28);
  this_00 = (BlockMemoryPool *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (BlockMemoryPool *)0x0) {
    this_00 = (BlockMemoryPool *)0x0;
  }
  else {
    BlockMemoryPool::BlockMemoryPool(this_00,(uint)*args,(uint)*args_1);
  }
  return this_00;
}

Assistant:

T* AlloterWrap::PoolNew(Args&&... args) {
    uint32_t sz = sizeof(T);
    
    void* data = _alloter->MallocAlign(sz);
    if (!data) {
        return nullptr;
    }

    T* res = new(data) T(std::forward<Args>(args)...);
    return res;
}